

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O3

bool NES_APU_np_Write(void *chip,UINT16 adr,UINT8 val)

{
  char cVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  NES_APU *apu;
  UINT8 *pUVar7;
  uint uVar8;
  int iVar9;
  
  uVar6 = (uint)CONCAT62(in_register_00000032,adr);
  if ((uVar6 & 0xfffffff8) != 0x4000) {
    if (adr != 0x4015) {
      return false;
    }
    *(byte *)((long)chip + 0x158) = val & 1;
    bVar3 = val >> 1 & 1;
    *(byte *)((long)chip + 0x159) = bVar3;
    if ((val & 1) == 0) {
      *(undefined4 *)((long)chip + 0x150) = 0;
    }
    if (bVar3 == 0) {
      *(undefined4 *)((long)chip + 0x154) = 0;
    }
    pUVar7 = (UINT8 *)((long)chip + 0x45);
    goto LAB_00162ca4;
  }
  uVar6 = uVar6 & 7;
  uVar2 = (ulong)(uVar6 >> 2);
  switch(uVar6) {
  default:
    *(uint *)((long)chip + uVar2 * 4 + 0xf8) = val & 0xf;
    *(byte *)((long)chip + uVar2 + 0x130) = val >> 4 & 1;
    *(byte *)((long)chip + uVar2 + 0x132) = val >> 5 & 1;
    *(uint *)((long)chip + uVar2 * 4 + 0x138) = val & 0xf;
    uVar8 = (uint)(val >> 6);
    *(uint *)((long)chip + uVar2 * 4 + 0xf0) = uVar8;
    if (*(int *)((long)chip + 0x14) != 0) {
      if (uVar8 == 2) {
        *(undefined4 *)((long)chip + uVar2 * 4 + 0xf0) = 1;
      }
      else if (uVar8 == 1) {
        *(undefined4 *)((long)chip + uVar2 * 4 + 0xf0) = 2;
      }
    }
    break;
  case 1:
  case 5:
    *(UINT8 *)((long)chip + uVar2 + 0x110) = val >> 7;
    *(uint *)((long)chip + uVar2 * 4 + 0x118) = val >> 4 & 7;
    bVar3 = val >> 3;
    *(byte *)((long)chip + uVar2 + 0x112) = bVar3 & 1;
    *(uint *)((long)chip + uVar2 * 4 + 0x128) = val & 7;
    *(undefined1 *)((long)chip + uVar2 + 0x114) = 1;
    iVar9 = *(int *)((long)chip + uVar2 * 4 + 0x100);
    iVar5 = (uint)((ushort)uVar6 < 4 & bVar3) + (iVar9 >> (sbyte)(val & 7));
    iVar4 = -iVar5;
    if ((bVar3 & 1) == 0) {
      iVar4 = iVar5;
    }
    *(int *)((long)chip + uVar2 * 4 + 0x108) = iVar4 + iVar9;
    break;
  case 2:
  case 6:
    uVar8 = *(uint *)((long)chip + uVar2 * 4 + 0x100) & 0x700 | (uint)val;
    *(uint *)((long)chip + uVar2 * 4 + 0x100) = uVar8;
    goto LAB_00162bb6;
  case 3:
  case 7:
    uVar8 = (val & 7) << 8 | (uint)*(byte *)((long)chip + uVar2 * 4 + 0x100);
    *(uint *)((long)chip + uVar2 * 4 + 0x100) = uVar8;
    if (*(int *)((long)chip + 0x10) != 0) {
      *(undefined4 *)((long)chip + uVar2 * 4 + 0xe8) = 0;
    }
    *(undefined1 *)((long)chip + uVar2 + 0x134) = 1;
    if (*(char *)((long)chip + uVar2 + 0x158) != '\0') {
      *(uint *)((long)chip + uVar2 * 4 + 0x150) = (uint)NES_APU_np_Write::length_table[val >> 3];
    }
LAB_00162bb6:
    cVar1 = *(char *)((long)chip + uVar2 + 0x112);
    iVar4 = (uint)(cVar1 != '\0' && (ushort)uVar6 < 4) +
            (uVar8 >> (*(byte *)((long)chip + uVar2 * 4 + 0x128) & 0x1f));
    iVar9 = -iVar4;
    if (cVar1 == '\0') {
      iVar9 = iVar4;
    }
    *(uint *)((long)chip + uVar2 * 4 + 0x108) = iVar9 + uVar8;
    if ((int)uVar8 < *(int *)((long)chip + uVar2 * 4 + 0xe0)) {
      *(uint *)((long)chip + uVar2 * 4 + 0xe0) = uVar8;
    }
  }
  pUVar7 = (UINT8 *)((long)chip + (ulong)uVar6 + 0x30);
LAB_00162ca4:
  *pUVar7 = val;
  return true;
}

Assistant:

bool NES_APU_np_Write(void* chip, UINT16 adr, UINT8 val)
{
	NES_APU* apu = (NES_APU*)chip;
	int ch;

	static const UINT8 length_table[32] = {
		0x0A, 0xFE,
		0x14, 0x02,
		0x28, 0x04,
		0x50, 0x06,
		0xA0, 0x08,
		0x3C, 0x0A,
		0x0E, 0x0C,
		0x1A, 0x0E,
		0x0C, 0x10,
		0x18, 0x12,
		0x30, 0x14,
		0x60, 0x16,
		0xC0, 0x18,
		0x48, 0x1A,
		0x10, 0x1C,
		0x20, 0x1E
	};

	if (0x4000 <= adr && adr < 0x4008)
	{
		//DEBUG_OUT("$%04X = %02X\n",adr,val);

		adr &= 0xf;
		ch = adr >> 2;
		switch (adr)
		{
		case 0x0:
		case 0x4:
			apu->volume[ch] = val & 15;
			apu->envelope_disable[ch] = (val >> 4) & 1;
			apu->envelope_loop[ch] = (val >> 5) & 1;
			apu->envelope_div_period[ch] = (val & 15);
			apu->duty[ch] = (val >> 6) & 3;
			if (apu->option[OPT_DUTY_SWAP])
			{
				if      (apu->duty[ch] == 1) apu->duty[ch] = 2;
				else if (apu->duty[ch] == 2) apu->duty[ch] = 1;
			}
			break;

		case 0x1:
		case 0x5:
			apu->sweep_enable[ch] = (val >> 7) & 1;
			apu->sweep_div_period[ch] = (((val >> 4) & 7));
			apu->sweep_mode[ch] = (val >> 3) & 1;
			apu->sweep_amount[ch] = val & 7;
			apu->sweep_write[ch] = true;
			sweep_sqr(apu, ch);
			break;

		case 0x2:
		case 0x6:
			apu->freq[ch] = val | (apu->freq[ch] & 0x700) ;
			sweep_sqr(apu, ch);
			if (apu->scounter[ch] > apu->freq[ch]) apu->scounter[ch] = apu->freq[ch];
			break;

		case 0x3:
		case 0x7:
			apu->freq[ch] = (apu->freq[ch] & 0xFF) | ((val & 0x7) << 8) ;

			if (apu->option[OPT_PHASE_REFRESH])
				apu->sphase[ch] = 0;
			apu->envelope_write[ch] = true;
			if (apu->enable[ch])
			{
				apu->length_counter[ch] = length_table[(val >> 3) & 0x1f];
			}
			sweep_sqr(apu, ch);
			if (apu->scounter[ch] > apu->freq[ch]) apu->scounter[ch] = apu->freq[ch];
			break;

		default:
			return false;
		}
		apu->reg[adr] = val;
		return true;
	}
	else if (adr == 0x4015)
	{
		apu->enable[0] = (val & 1) ? true : false;
		apu->enable[1] = (val & 2) ? true : false;

		if (!apu->enable[0])
			apu->length_counter[0] = 0;
		if (!apu->enable[1])
			apu->length_counter[1] = 0;

		apu->reg[adr-0x4000] = val;
		return true;
	}

	// 4017 is handled in np_nes_dmc.c
	//else if (adr == 0x4017)
	//{
	//}

	return false;
}